

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O3

Ssh_gss_stat ssh_gssapi_display_status(ssh_gss_library *lib,Ssh_gss_ctx ctx,Ssh_gss_buf *buf)

{
  OM_uint32 OVar1;
  void *__dest;
  gss_buffer_t pgVar2;
  Ssh_gss_stat SVar3;
  OM_uint32 lmin;
  OM_uint32 ccc;
  gss_buffer_desc msg_min;
  gss_buffer_desc msg_maj;
  OM_uint32 local_60 [2];
  gss_buffer_desc_struct local_58;
  gss_buffer_desc_struct local_48;
  
  local_48.length = 0;
  local_48.value = (void *)0x0;
  local_58.length = 0;
  local_58.value = (void *)0x0;
  buf->length = 0;
  buf->value = (void *)0x0;
  local_60[1] = 0;
  OVar1 = (*(lib->u).gssapi.display_status)
                    (local_60,*ctx,1,&gss_mech_krb5_desc,local_60 + 1,&local_48);
  SVar3 = SSH_GSS_FAILURE;
  if (OVar1 == 0) {
    local_60[1] = 0;
    pgVar2 = &local_58;
    OVar1 = (*(lib->u).gssapi.display_status)
                      (local_60,*(OM_uint32 *)((long)ctx + 4),2,&gss_mech_krb5_desc,local_60 + 1,
                       pgVar2);
    if (OVar1 == 0) {
      buf->length = local_58.length + local_48.length + 1;
      SVar3 = SSH_GSS_OK;
      __dest = safemalloc(local_58.length + local_48.length + 2,1,0);
      buf->value = __dest;
      memcpy(__dest,local_48.value,local_48.length);
      *(undefined1 *)((long)buf->value + local_48.length) = 0x20;
      memcpy((void *)((long)buf->value + local_48.length + 1),local_58.value,local_58.length);
      *(undefined1 *)((long)buf->value + buf->length) = 0;
      (*(lib->u).gssapi.release_buffer)(local_60,&local_48);
    }
    else {
      SVar3 = SSH_GSS_FAILURE;
      pgVar2 = &local_48;
    }
    (*(lib->u).gssapi.release_buffer)(local_60,pgVar2);
  }
  return SVar3;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_display_status(struct ssh_gss_library *lib,
                                              Ssh_gss_ctx ctx,
                                              Ssh_gss_buf *buf)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gssapi_ssh_gss_ctx *gssctx = (gssapi_ssh_gss_ctx *) ctx;
    OM_uint32 lmin,lmax;
    OM_uint32 ccc;
    gss_buffer_desc msg_maj=GSS_C_EMPTY_BUFFER;
    gss_buffer_desc msg_min=GSS_C_EMPTY_BUFFER;

    /* Return empty buffer in case of failure */
    SSH_GSS_CLEAR_BUF(buf);

    /* get first mesg from GSS */
    ccc=0;
    lmax=gss->display_status(&lmin,gssctx->maj_stat,GSS_C_GSS_CODE,(gss_OID) GSS_MECH_KRB5,&ccc,&msg_maj);

    if (lmax != GSS_S_COMPLETE) return SSH_GSS_FAILURE;

    /* get first mesg from Kerberos */
    ccc=0;
    lmax=gss->display_status(&lmin,gssctx->min_stat,GSS_C_MECH_CODE,(gss_OID) GSS_MECH_KRB5,&ccc,&msg_min);

    if (lmax != GSS_S_COMPLETE) {
        gss->release_buffer(&lmin, &msg_maj);
        return SSH_GSS_FAILURE;
    }

    /* copy data into buffer */
    buf->length = msg_maj.length + msg_min.length + 1;
    buf->value = snewn(buf->length + 1, char);

    /* copy mem */
    memcpy((char *)buf->value, msg_maj.value, msg_maj.length);
    ((char *)buf->value)[msg_maj.length] = ' ';
    memcpy((char *)buf->value + msg_maj.length + 1, msg_min.value, msg_min.length);
    ((char *)buf->value)[buf->length] = 0;
    /* free mem & exit */
    gss->release_buffer(&lmin, &msg_maj);
    gss->release_buffer(&lmin, &msg_min);
    return SSH_GSS_OK;
}